

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O0

int Ivy_ManCleanupSeq(Ivy_Man_t *p)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  Vec_Ptr_t *p_00;
  uint uVar3;
  int local_2c;
  int RetValue;
  int i;
  Ivy_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Ivy_Man_t *p_local;
  
  pIVar2 = Ivy_ManConst1(p);
  Ivy_ObjSetMarkA(pIVar2);
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vPis), local_2c < iVar1; local_2c = local_2c + 1) {
    pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(p->vPis,local_2c);
    Ivy_ObjSetMarkA(pIVar2);
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vPos), local_2c < iVar1; local_2c = local_2c + 1) {
    pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(p->vPos,local_2c);
    Ivy_ManCleanupSeq_rec(pIVar2);
  }
  p_00 = Vec_PtrAlloc(100);
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
    pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,local_2c);
    if (pIVar2 != (Ivy_Obj_t *)0x0) {
      iVar1 = Ivy_ObjIsMarkA(pIVar2);
      if (iVar1 == 0) {
        Vec_PtrPush(p_00,pIVar2);
      }
      else {
        Ivy_ObjClearMarkA(pIVar2);
      }
    }
  }
  iVar1 = Vec_PtrSize(p_00);
  if (iVar1 == 0) {
    Vec_PtrFree(p_00);
    p_local._4_4_ = 0;
  }
  else {
    for (local_2c = 0; iVar1 = Vec_PtrSize(p_00), local_2c < iVar1; local_2c = local_2c + 1) {
      pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(p_00,local_2c);
      Ivy_ObjDisconnect(p,pIVar2);
    }
    for (local_2c = 0; iVar1 = Vec_PtrSize(p_00), local_2c < iVar1; local_2c = local_2c + 1) {
      pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(p_00,local_2c);
      iVar1 = Ivy_ObjIsNode(pIVar2);
      if (((iVar1 == 0) && (iVar1 = Ivy_ObjIsLatch(pIVar2), iVar1 == 0)) &&
         (iVar1 = Ivy_ObjIsBuf(pIVar2), iVar1 == 0)) {
        __assert_fail("Ivy_ObjIsNode(pObj) || Ivy_ObjIsLatch(pObj) || Ivy_ObjIsBuf(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                      ,0x158,"int Ivy_ManCleanupSeq(Ivy_Man_t *)");
      }
      iVar1 = Ivy_ObjRefs(pIVar2);
      if (iVar1 != 0) {
        __assert_fail("Ivy_ObjRefs(pObj) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                      ,0x159,"int Ivy_ManCleanupSeq(Ivy_Man_t *)");
      }
      uVar3 = *(uint *)&pIVar2->field_0x8 & 0xf;
      p->nObjs[uVar3] = p->nObjs[uVar3] + -1;
      p->nDeleted = p->nDeleted + 1;
      if ((p->fFanout != 0) && (iVar1 = Ivy_ObjIsBuf(pIVar2), iVar1 != 0)) {
        Vec_PtrRemove(p->vBufs,pIVar2);
      }
      Vec_PtrWriteEntry(p->vObjs,pIVar2->Id,(void *)0x0);
      Ivy_ManRecycleMemory(p,pIVar2);
    }
    p_local._4_4_ = Vec_PtrSize(p_00);
    Vec_PtrFree(p_00);
  }
  return p_local._4_4_;
}

Assistant:

int Ivy_ManCleanupSeq( Ivy_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Ivy_Obj_t * pObj;
    int i, RetValue;
    // mark the constant and PIs
    Ivy_ObjSetMarkA( Ivy_ManConst1(p) );
    Ivy_ManForEachPi( p, pObj, i )
        Ivy_ObjSetMarkA( pObj );
    // mark nodes visited from POs
    Ivy_ManForEachPo( p, pObj, i )
        Ivy_ManCleanupSeq_rec( pObj );
    // collect unmarked nodes
    vNodes = Vec_PtrAlloc( 100 );
    Ivy_ManForEachObj( p, pObj, i )
    {
        if ( Ivy_ObjIsMarkA(pObj) )
            Ivy_ObjClearMarkA(pObj);
        else
            Vec_PtrPush( vNodes, pObj );
    }
    if ( Vec_PtrSize(vNodes) == 0 )
    {
        Vec_PtrFree( vNodes );
//printf( "Sequential sweep cleaned out %d nodes.\n", 0 );
        return 0;
    }
    // disconnect the marked objects
    Vec_PtrForEachEntry( Ivy_Obj_t *, vNodes, pObj, i )
        Ivy_ObjDisconnect( p, pObj );
    // remove the dangling objects
    Vec_PtrForEachEntry( Ivy_Obj_t *, vNodes, pObj, i )
    {
        assert( Ivy_ObjIsNode(pObj) || Ivy_ObjIsLatch(pObj) || Ivy_ObjIsBuf(pObj) );
        assert( Ivy_ObjRefs(pObj) == 0 );
        // update node counters of the manager
        p->nObjs[pObj->Type]--;
        p->nDeleted++;
        // delete buffer from the array of buffers
        if ( p->fFanout && Ivy_ObjIsBuf(pObj) )
            Vec_PtrRemove( p->vBufs, pObj );
        // free the node
        Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
        Ivy_ManRecycleMemory( p, pObj );
    }
    // return the number of nodes freed
    RetValue = Vec_PtrSize(vNodes);
    Vec_PtrFree( vNodes );
//printf( "Sequential sweep cleaned out %d nodes.\n", RetValue );
    return RetValue;
}